

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineDepthStencilStateCreateInfo>
          (Impl *this,VkPipelineDepthStencilStateCreateInfo **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  VkPipelineDepthStencilStateCreateInfo *__src;
  bool bVar1;
  VkPipelineDepthStencilStateCreateInfo *__dest;
  bool bVar2;
  void *pNext;
  void *local_38;
  
  __src = *sub_info;
  bVar2 = true;
  if (__src != (VkPipelineDepthStencilStateCreateInfo *)0x0) {
    __dest = (VkPipelineDepthStencilStateCreateInfo *)
             ScratchAllocator::allocate_raw(alloc,0x68,0x10);
    if (__dest != (VkPipelineDepthStencilStateCreateInfo *)0x0) {
      memmove(__dest,__src,0x68);
    }
    *sub_info = __dest;
    local_38 = (void *)0x0;
    bVar1 = copy_pnext_chain(this,__dest->pNext,alloc,&local_38,dynamic_state_info,state_flags);
    if (bVar1) {
      (*sub_info)->pNext = local_38;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}